

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void ma_rbi_log(ma_rbi *m)

{
  undefined8 in_RAX;
  
  if (m == (ma_rbi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x184,"void ma_rbi_log(const struct ma_rbi *)");
  }
  if (m->body == (body *)0x0) {
    __assert_fail("m->body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x185,"void ma_rbi_log(const struct ma_rbi *)");
  }
  if (m->point == (point *)0x0) {
    __assert_fail("m->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x186,"void ma_rbi_log(const struct ma_rbi *)");
  }
  if (m->frame != (frame *)0x0) {
    printf("RigidBodyInertiaADT(point=%s|%s, frame={%s})\n",m->point->name,m->body->name,
           m->frame->name,in_RAX);
    return;
  }
  __assert_fail("m->frame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x187,"void ma_rbi_log(const struct ma_rbi *)");
}

Assistant:

void ma_rbi_log(
        const struct ma_rbi *m)
{
    assert(m);
    assert(m->body);
    assert(m->point);
    assert(m->frame);

    printf("RigidBodyInertiaADT(point=%s|%s, frame={%s})\n",
        m->point->name,
        m->body->name,
        m->frame->name);
}